

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O0

void __thiscall
Assimp::D3MF::D3MFExporter::writeRelInfoToFile(D3MFExporter *this,string *folder,string *relName)

{
  zip_t *pzVar1;
  DeadlyImportError *this_00;
  char *entryname;
  void *buf;
  size_t bufsize;
  string local_c0 [32];
  string *local_a0;
  string *exportTxt;
  undefined1 local_78 [8];
  string entry;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *relName_local;
  string *folder_local;
  D3MFExporter *this_local;
  
  local_20 = relName;
  relName_local = folder;
  folder_local = &this->mArchiveName;
  if (this->m_zipArchive == (zip_t *)0x0) {
    entry.field_2._M_local_buf[0xb] = '\x01';
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"3MF-Export: Zip archive not valid, nullptr.",&local_41);
    DeadlyImportError::DeadlyImportError(this_00,&local_40);
    entry.field_2._M_local_buf[0xb] = '\0';
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exportTxt,
                 folder,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exportTxt,
                 local_20);
  std::__cxx11::string::~string((string *)&exportTxt);
  pzVar1 = this->m_zipArchive;
  entryname = (char *)std::__cxx11::string::c_str();
  zip_entry_open(pzVar1,entryname);
  std::__cxx11::ostringstream::str();
  local_a0 = local_c0;
  pzVar1 = this->m_zipArchive;
  buf = (void *)std::__cxx11::string::c_str();
  bufsize = std::__cxx11::string::size();
  zip_entry_write(pzVar1,buf,bufsize);
  zip_entry_close(this->m_zipArchive);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void D3MFExporter::writeRelInfoToFile( const std::string &folder, const std::string &relName ) {
    if ( nullptr == m_zipArchive ) {
        throw DeadlyExportError( "3MF-Export: Zip archive not valid, nullptr." );
    }
    const std::string entry = folder + "/" + relName;
    zip_entry_open( m_zipArchive, entry.c_str() );

    const std::string &exportTxt( mRelOutput.str() );
    zip_entry_write( m_zipArchive, exportTxt.c_str(), exportTxt.size() );

    zip_entry_close( m_zipArchive );
}